

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase36::run(TestCase36 *this)

{
  PromiseNode *pPVar1;
  undefined8 uVar2;
  TransformPromiseNodeBase *this_00;
  bool done;
  Promise<void> promise;
  WaitScope waitScope;
  EventLoop loop;
  char local_1d1;
  Own<kj::_::PromiseNode> local_1d0;
  WaitScope local_1c0;
  EventLoop local_1b0;
  ExceptionOrValue local_178;
  char local_18;
  
  EventLoop::EventLoop(&local_1b0);
  local_1c0.busyPollInterval = 0xffffffff;
  local_1c0.loop = &local_1b0;
  EventLoop::enterScope(&local_1b0);
  local_1d1 = '\0';
  _::yield();
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_178,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:42:37),_kj::_::PropagateException>
             ::anon_class_8_1_898ad080_for_func::operator());
  uVar2 = local_178.exception.ptr.field_1.value.ownFile.content.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00433e20;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_1d1;
  local_1d0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase36::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_1d0.ptr = (PromiseNode *)this_00;
  if ((PromiseNode *)local_178.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_178.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT71(local_178.exception.ptr._1_7_,local_178.exception.ptr.isSet)
    )((undefined8 *)CONCAT71(local_178.exception.ptr._1_7_,local_178.exception.ptr.isSet),
      (char *)(uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
  }
  if ((local_1d1 == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[25]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"!(done)\"",
               (char (*) [25])"failed: expected !(done)");
  }
  local_178.exception.ptr.isSet = false;
  local_18 = '\0';
  _::waitImpl(&local_1d0,&local_178,&local_1c0);
  if (local_18 == '\x01') {
    if (local_178.exception.ptr.isSet != false) {
      throwRecoverableException(&local_178.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_178.exception.ptr.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_178.exception.ptr.field_1.value,0);
  }
  if (local_178.exception.ptr.isSet == true) {
    Exception::~Exception(&local_178.exception.ptr.field_1.value);
  }
  if ((local_1d1 == '\0') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[22]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2d,ERROR,"\"failed: expected \" \"done\"",(char (*) [22])"failed: expected done");
  }
  pPVar1 = local_1d0.ptr;
  if ((TransformPromiseNodeBase *)local_1d0.ptr != (TransformPromiseNodeBase *)0x0) {
    local_1d0.ptr = (PromiseNode *)0x0;
    (**(local_1d0.disposer)->_vptr_Disposer)
              (local_1d0.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_1c0.loop);
  EventLoop::~EventLoop(&local_1b0);
  return;
}

Assistant:

TEST(Async, EvalVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  bool done = false;

  Promise<void> promise = evalLater([&]() { done = true; });
  EXPECT_FALSE(done);
  promise.wait(waitScope);
  EXPECT_TRUE(done);
}